

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O1

int __thiscall squall::TableBase::call<int>(TableBase *this,string *name)

{
  HSQUIRRELVM v;
  SQInteger newtop;
  longlong r;
  int local_20 [2];
  
  v = this->vm_;
  newtop = sq_gettop(v);
  detail::call_setup<>(v,&this->tableobj_,name);
  detail::check_argument_type<(squall::detail::FetchContext)1>(v,-1,OT_INTEGER);
  sq_getinteger(v,-1,(SQInteger *)local_20);
  sq_settop(v,newtop);
  return local_20[0];
}

Assistant:

R call(const string& name, T... args) {
        return detail::call<R>(vm_, tableobj_, name, args...);
    }